

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

int AF_AActor_CheckMissileSpawn
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AActor *th;
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar3;
  char *pcVar4;
  bool bVar5;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      th = (AActor *)(param->field_0).field_1.a;
      if (th != (AActor *)0x0) {
        if ((th->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar2 = (**(th->super_DThinker).super_DObject._vptr_DObject)(th);
          (th->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
        }
        pPVar3 = (th->super_DThinker).super_DObject.Class;
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 != pPVar1 && bVar5) {
          do {
            pPVar3 = pPVar3->ParentClass;
            bVar5 = pPVar3 != (PClass *)0x0;
            if (pPVar3 == pPVar1) break;
          } while (pPVar3 != (PClass *)0x0);
        }
        if (!bVar5) {
          pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00430134;
        }
      }
      if (numparam == 1) {
        pcVar4 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\x01') {
          bVar5 = P_CheckMissileSpawn(th,param[1].field_0.f);
          if (numret < 1) {
            iVar2 = 0;
          }
          else {
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                            ,0x18d1,
                            "int AF_AActor_CheckMissileSpawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            if (ret->RegType != '\0') {
              __assert_fail("RegType == REGT_INT",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                            ,0x13f,"void VMReturn::SetInt(int)");
            }
            *(uint *)ret->Location = (uint)bVar5;
            iVar2 = 1;
          }
          return iVar2;
        }
        pcVar4 = "param[paramnum].Type == REGT_FLOAT";
      }
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                    ,0x18d0,
                    "int AF_AActor_CheckMissileSpawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_00430134:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x18cf,
                "int AF_AActor_CheckMissileSpawn(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, CheckMissileSpawn)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(add);
	ACTION_RETURN_BOOL(P_CheckMissileSpawn(self, add));
}